

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  long lVar1;
  optional<std::__cxx11::string> *this_00;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  iterator __position;
  size_type __rlen;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  char local_109;
  undefined1 local_108 [16];
  code *local_f8;
  code *local_f0;
  ulong local_e8;
  char *local_e0;
  key_type local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  cmAlphaNum local_58;
  
  lVar1 = std::__cxx11::string::find((char)envmod,0x3d);
  if (lVar1 == -1) {
    local_f0 = (code *)(envmod->_M_dataplus)._M_p;
    local_f8 = (code *)envmod->_M_string_length;
    local_108._0_8_ = (pointer)0x2f;
    local_108._8_8_ = "Error: Missing `=` after the variable name in: ";
    local_e0 = local_58.Digits_;
    local_58.View_._M_len = 1;
    local_58.Digits_[0] = '\n';
    local_e8._0_1_ = '\x01';
    local_e8._1_1_ = '\0';
    local_e8._2_1_ = '\0';
    local_e8._3_1_ = '\0';
    local_e8._4_1_ = '\0';
    local_e8._5_1_ = '\0';
    local_e8._6_1_ = '\0';
    local_e8._7_1_ = '\0';
    views._M_len = 3;
    views._M_array = (iterator)local_108;
    local_58.View_._M_str = local_e0;
    cmCatViews_abi_cxx11_(&local_d8,views);
    Error(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)envmod);
  lVar1 = std::__cxx11::string::find((char)envmod,0x3a);
  if (lVar1 == -1) {
    local_f0 = (code *)(envmod->_M_dataplus)._M_p;
    local_f8 = (code *)envmod->_M_string_length;
    local_108._0_8_ = (pointer)0x2b;
    local_108._8_8_ = "Error: Missing `:` after the operation in: ";
    local_e0 = local_58.Digits_;
    local_58.View_._M_len = 1;
    local_58.Digits_[0] = '\n';
    local_e8 = 1;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_108;
    local_58.View_._M_str = local_e0;
    cmCatViews_abi_cxx11_(&local_b8,views_00);
    Error(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    bVar2 = false;
    goto LAB_00114832;
  }
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)envmod);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)envmod);
  switch(local_b8._M_string_length) {
  case 3:
    if (local_b8._M_dataplus._M_p[2] != 't' || *(short *)local_b8._M_dataplus._M_p != 0x6573) break;
    this_00 = (optional<std::__cxx11::string> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->diff,&local_d8);
    bVar2 = true;
    std::optional<std::__cxx11::string>::operator=(this_00,&local_78);
    goto LAB_001147f6;
  case 5:
    if (local_b8._M_dataplus._M_p[4] == 't' && *(int *)local_b8._M_dataplus._M_p == 0x65736572) {
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)this,&local_d8);
      bVar2 = true;
      if (__position._M_node != (_Base_ptr)&this->field_0x8) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)this,(const_iterator)__position._M_node);
      }
      goto LAB_001147f6;
    }
    if (local_b8._M_dataplus._M_p[4] == 't' && *(int *)local_b8._M_dataplus._M_p == 0x65736e75) {
      local_e8 = local_e8 & 0xffffffffffffff00;
      this_01 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator[](&this->diff,&local_d8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign(this_01,(_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_108);
      if (((bool)(undefined1)local_e8 == true) &&
         (local_e8 = local_e8 & 0xffffffffffffff00, (code **)local_108._0_8_ != &local_f8)) {
        operator_delete((void *)local_108._0_8_,(ulong)((long)local_f8 + 1));
      }
      goto LAB_001147f3;
    }
    break;
  case 0xd:
    if (*(long *)(local_b8._M_dataplus._M_p + 5) == 0x646e657070615f67 &&
        *(long *)local_b8._M_dataplus._M_p == 0x615f676e69727473) {
      local_108._8_8_ = (char *)0x0;
      local_f0 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1744:22)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1744:22)>
                 ::_M_manager;
      local_108._0_8_ = &local_78;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&local_d8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_108);
      if (local_f8 != (_Manager_type)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
      goto LAB_001147f3;
    }
    break;
  case 0xe:
    if (*(long *)(local_b8._M_dataplus._M_p + 6) == 0x646e65706572705f &&
        *(long *)local_b8._M_dataplus._M_p == 0x705f676e69727473) {
      local_108._8_8_ = (char *)0x0;
      local_f0 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1747:16)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1747:16)>
                 ::_M_manager;
      local_108._0_8_ = &local_78;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&local_d8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_108);
      if (local_f8 != (_Manager_type)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
      goto LAB_001147f3;
    }
    break;
  case 0x10:
    auVar6[0] = -(*local_b8._M_dataplus._M_p == 'p');
    auVar6[1] = -(local_b8._M_dataplus._M_p[1] == 'a');
    auVar6[2] = -(local_b8._M_dataplus._M_p[2] == 't');
    auVar6[3] = -(local_b8._M_dataplus._M_p[3] == 'h');
    auVar6[4] = -(local_b8._M_dataplus._M_p[4] == '_');
    auVar6[5] = -(local_b8._M_dataplus._M_p[5] == 'l');
    auVar6[6] = -(local_b8._M_dataplus._M_p[6] == 'i');
    auVar6[7] = -(local_b8._M_dataplus._M_p[7] == 's');
    auVar6[8] = -(local_b8._M_dataplus._M_p[8] == 't');
    auVar6[9] = -(local_b8._M_dataplus._M_p[9] == '_');
    auVar6[10] = -(local_b8._M_dataplus._M_p[10] == 'a');
    auVar6[0xb] = -(local_b8._M_dataplus._M_p[0xb] == 'p');
    auVar6[0xc] = -(local_b8._M_dataplus._M_p[0xc] == 'p');
    auVar6[0xd] = -(local_b8._M_dataplus._M_p[0xd] == 'e');
    auVar6[0xe] = -(local_b8._M_dataplus._M_p[0xe] == 'n');
    auVar6[0xf] = -(local_b8._M_dataplus._M_p[0xf] == 'd');
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
        == 0xffff) {
      local_108._8_8_ = (char *)0x3a;
      local_f0 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1749:22)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1749:22)>
                 ::_M_manager;
      local_108._0_8_ = &local_78;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&local_d8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_108);
      if (local_f8 != (_Manager_type)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
      goto LAB_001147f3;
    }
    break;
  case 0x11:
    auVar3[0] = -(*local_b8._M_dataplus._M_p == 'p');
    auVar3[1] = -(local_b8._M_dataplus._M_p[1] == 'a');
    auVar3[2] = -(local_b8._M_dataplus._M_p[2] == 't');
    auVar3[3] = -(local_b8._M_dataplus._M_p[3] == 'h');
    auVar3[4] = -(local_b8._M_dataplus._M_p[4] == '_');
    auVar3[5] = -(local_b8._M_dataplus._M_p[5] == 'l');
    auVar3[6] = -(local_b8._M_dataplus._M_p[6] == 'i');
    auVar3[7] = -(local_b8._M_dataplus._M_p[7] == 's');
    auVar3[8] = -(local_b8._M_dataplus._M_p[8] == 't');
    auVar3[9] = -(local_b8._M_dataplus._M_p[9] == '_');
    auVar3[10] = -(local_b8._M_dataplus._M_p[10] == 'p');
    auVar3[0xb] = -(local_b8._M_dataplus._M_p[0xb] == 'r');
    auVar3[0xc] = -(local_b8._M_dataplus._M_p[0xc] == 'e');
    auVar3[0xd] = -(local_b8._M_dataplus._M_p[0xd] == 'p');
    auVar3[0xe] = -(local_b8._M_dataplus._M_p[0xe] == 'e');
    auVar3[0xf] = -(local_b8._M_dataplus._M_p[0xf] == 'n');
    auVar7[0] = -(local_b8._M_dataplus._M_p[0x10] == 'd');
    auVar7[1] = 0xff;
    auVar7[2] = 0xff;
    auVar7[3] = 0xff;
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar7 = auVar7 & auVar3;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      local_108._8_8_ = (char *)0x3a;
      local_f0 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1756:22)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1756:22)>
                 ::_M_manager;
      local_108._0_8_ = &local_78;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&local_d8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_108);
      if (local_f8 != (_Manager_type)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
    }
    else {
      auVar4[0] = -(*local_b8._M_dataplus._M_p == 'c');
      auVar4[1] = -(local_b8._M_dataplus._M_p[1] == 'm');
      auVar4[2] = -(local_b8._M_dataplus._M_p[2] == 'a');
      auVar4[3] = -(local_b8._M_dataplus._M_p[3] == 'k');
      auVar4[4] = -(local_b8._M_dataplus._M_p[4] == 'e');
      auVar4[5] = -(local_b8._M_dataplus._M_p[5] == '_');
      auVar4[6] = -(local_b8._M_dataplus._M_p[6] == 'l');
      auVar4[7] = -(local_b8._M_dataplus._M_p[7] == 'i');
      auVar4[8] = -(local_b8._M_dataplus._M_p[8] == 's');
      auVar4[9] = -(local_b8._M_dataplus._M_p[9] == 't');
      auVar4[10] = -(local_b8._M_dataplus._M_p[10] == '_');
      auVar4[0xb] = -(local_b8._M_dataplus._M_p[0xb] == 'a');
      auVar4[0xc] = -(local_b8._M_dataplus._M_p[0xc] == 'p');
      auVar4[0xd] = -(local_b8._M_dataplus._M_p[0xd] == 'p');
      auVar4[0xe] = -(local_b8._M_dataplus._M_p[0xe] == 'e');
      auVar4[0xf] = -(local_b8._M_dataplus._M_p[0xf] == 'n');
      auVar8[0] = -(local_b8._M_dataplus._M_p[0x10] == 'd');
      auVar8[1] = 0xff;
      auVar8[2] = 0xff;
      auVar8[3] = 0xff;
      auVar8[4] = 0xff;
      auVar8[5] = 0xff;
      auVar8[6] = 0xff;
      auVar8[7] = 0xff;
      auVar8[8] = 0xff;
      auVar8[9] = 0xff;
      auVar8[10] = 0xff;
      auVar8[0xb] = 0xff;
      auVar8[0xc] = 0xff;
      auVar8[0xd] = 0xff;
      auVar8[0xe] = 0xff;
      auVar8[0xf] = 0xff;
      auVar8 = auVar8 & auVar4;
      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff) break;
      local_108._8_8_ = (char *)0x0;
      local_f0 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1763:22)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1763:22)>
                 ::_M_manager;
      local_108._0_8_ = &local_78;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&local_d8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_108);
      if (local_f8 != (_Manager_type)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
    }
LAB_001147f3:
    bVar2 = true;
    goto LAB_001147f6;
  case 0x12:
    auVar5[0] = -(*local_b8._M_dataplus._M_p == 'c');
    auVar5[1] = -(local_b8._M_dataplus._M_p[1] == 'm');
    auVar5[2] = -(local_b8._M_dataplus._M_p[2] == 'a');
    auVar5[3] = -(local_b8._M_dataplus._M_p[3] == 'k');
    auVar5[4] = -(local_b8._M_dataplus._M_p[4] == 'e');
    auVar5[5] = -(local_b8._M_dataplus._M_p[5] == '_');
    auVar5[6] = -(local_b8._M_dataplus._M_p[6] == 'l');
    auVar5[7] = -(local_b8._M_dataplus._M_p[7] == 'i');
    auVar5[8] = -(local_b8._M_dataplus._M_p[8] == 's');
    auVar5[9] = -(local_b8._M_dataplus._M_p[9] == 't');
    auVar5[10] = -(local_b8._M_dataplus._M_p[10] == '_');
    auVar5[0xb] = -(local_b8._M_dataplus._M_p[0xb] == 'p');
    auVar5[0xc] = -(local_b8._M_dataplus._M_p[0xc] == 'r');
    auVar5[0xd] = -(local_b8._M_dataplus._M_p[0xd] == 'e');
    auVar5[0xe] = -(local_b8._M_dataplus._M_p[0xe] == 'p');
    auVar5[0xf] = -(local_b8._M_dataplus._M_p[0xf] == 'e');
    auVar9[0] = -((char)*(short *)(local_b8._M_dataplus._M_p + 0x10) == 'n');
    auVar9[1] = -((char)((ushort)*(short *)(local_b8._M_dataplus._M_p + 0x10) >> 8) == 'd');
    auVar9[2] = 0xff;
    auVar9[3] = 0xff;
    auVar9[4] = 0xff;
    auVar9[5] = 0xff;
    auVar9[6] = 0xff;
    auVar9[7] = 0xff;
    auVar9[8] = 0xff;
    auVar9[9] = 0xff;
    auVar9[10] = 0xff;
    auVar9[0xb] = 0xff;
    auVar9[0xc] = 0xff;
    auVar9[0xd] = 0xff;
    auVar9[0xe] = 0xff;
    auVar9[0xf] = 0xff;
    auVar9 = auVar9 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
      local_108._8_8_ = (char *)0x0;
      local_f0 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1770:22)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:1770:22)>
                 ::_M_manager;
      local_108._0_8_ = &local_78;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)this,&local_d8,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_108);
      if (local_f8 != (_Manager_type)0x0) {
        (*local_f8)(local_108,local_108,3);
      }
      goto LAB_001147f3;
    }
  }
  local_108._0_8_ = (pointer)0x37;
  local_108._8_8_ = "Error: Unrecognized environment manipulation argument: ";
  local_58.View_._M_len = local_b8._M_string_length;
  local_58.View_._M_str = local_b8._M_dataplus._M_p;
  local_109 = '\n';
  cmStrCat<char>(&local_98,(cmAlphaNum *)local_108,&local_58,&local_109);
  Error(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_001147f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_00114832:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = {};
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}